

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_extract_aux(REF_NODE ref_node,REF_INT *ldim,REF_DBL **aux)

{
  uint uVar1;
  uint uVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  REF_STATUS RVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  
  uVar1 = ref_node->naux;
  *ldim = uVar1;
  uVar2 = ref_node->max;
  if ((int)(uVar2 * uVar1) < 0) {
    RVar6 = 1;
    pcVar9 = "malloc *aux of REF_DBL negative";
  }
  else {
    pRVar5 = (REF_DBL *)malloc((ulong)(uVar2 * uVar1) << 3);
    *aux = pRVar5;
    if (pRVar5 != (REF_DBL *)0x0) {
      if (0 < (int)uVar2) {
        pRVar3 = ref_node->global;
        lVar7 = 0;
        uVar8 = 0;
        do {
          if (-1 < pRVar3[uVar8] && 0 < (int)uVar1) {
            pRVar4 = ref_node->aux;
            uVar10 = 0;
            do {
              pRVar5[uVar10] = *(REF_DBL *)((long)pRVar4 + uVar10 * 8 + lVar7);
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
          }
          uVar8 = uVar8 + 1;
          pRVar5 = pRVar5 + (int)uVar1;
          lVar7 = lVar7 + (long)(int)uVar1 * 8;
        } while (uVar8 != uVar2);
      }
      return 0;
    }
    RVar6 = 2;
    pcVar9 = "malloc *aux of REF_DBL NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa97,
         "ref_node_extract_aux",pcVar9);
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_extract_aux(REF_NODE ref_node, REF_INT *ldim,
                                        REF_DBL **aux) {
  REF_INT iaux, node;
  (*ldim) = ref_node_naux(ref_node);
  ref_malloc(*aux, (*ldim) * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (iaux = 0; iaux < ref_node_naux(ref_node); iaux++) {
      (*aux)[iaux + (*ldim) * node] = ref_node_aux(ref_node, iaux, node);
    }
  }
  return REF_SUCCESS;
}